

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O0

UINT8 device_start_k054539(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  void *pvVar1;
  double dVar2;
  double dVar3;
  k054539_state *info;
  int i;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0xbd0);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    for (info._4_4_ = 0; info._4_4_ < 8; info._4_4_ = info._4_4_ + 1) {
      *(undefined8 *)((long)devData.chipInf + (long)info._4_4_ * 8 + 0x880) = 0x3ff0000000000000;
    }
    *(undefined1 *)&((DEV_DATA *)((long)devData.chipInf + 0x8d8))->chipInf = 0;
    for (info._4_4_ = 0; info._4_4_ < 0x100; info._4_4_ = info._4_4_ + 1) {
      dVar2 = pow(10.0,(((double)info._4_4_ * -36.0) / 64.0) / 20.0);
      *(double *)((long)devData.chipInf + (long)info._4_4_ * 8 + 8) = dVar2 / 4.0;
    }
    for (info._4_4_ = 0; info._4_4_ < 0xf; info._4_4_ = info._4_4_ + 1) {
      dVar2 = sqrt((double)info._4_4_);
      dVar3 = sqrt(14.0);
      *(double *)((long)devData.chipInf + (long)info._4_4_ * 8 + 0x808) = dVar2 / dVar3;
    }
    *(UINT32 *)((long)devData.chipInf + 0xbcc) = cfg->clock;
    *(byte *)&((DEV_DATA *)((long)devData.chipInf + 0x8d8))->chipInf =
         *(byte *)&((DEV_DATA *)((long)devData.chipInf + 0x8d8))->chipInf | 4;
    pvVar1 = malloc(0x4000);
    ((DEV_DATA *)((long)devData.chipInf + 0xb10))->chipInf = pvVar1;
    ((DEV_DATA *)((long)devData.chipInf + 0xb30))->chipInf = (void *)0x0;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0xb38))->chipInf = 0;
    *(undefined4 *)((long)devData.chipInf + 0xb3c) = 0;
    k054539_init_flags(devData.chipInf,cfg->flags);
    k054539_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,
                *(uint *)((long)devData.chipInf + 0xbcc) / 0x180,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_k054539(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	int i;
	k054539_state *info;

	info = (k054539_state *)calloc(1, sizeof(k054539_state));
	if (info == NULL)
		return 0xFF;

	//info->timer = timer_alloc(0);

	// resolve / bind callbacks
	//info->timer_handler.resolve_safe();
	//info->apan_cb.bind_relative_to(*owner());

	for (i = 0; i < 8; i++)
		info->gain[i] = 1.0;

	info->flags = K054539_RESET_FLAGS;

	/*
	    I've tried various equations on volume control but none worked consistently.
	    The upper four channels in most MW/GX games simply need a significant boost
	    to sound right. For example, the bass and smash sound volumes in Violent Storm
	    have roughly the same values and the voices in Tokimeki Puzzledama are given
	    values smaller than those of the hihats. Needless to say the two K054539 chips
	    in Mystic Warriors are completely out of balance. Rather than forcing a
	    "one size fits all" function to the voltab the current invert exponential
	    appraoch seems most appropriate.
	*/
	// Factor the 1/4 for the number of channels in the volume (1/8 is too harsh, 1/2 gives clipping)
	// vol=0 -> no attenuation, vol=0x40 -> -36dB
	for(i=0; i<256; i++)
		info->voltab[i] = pow(10.0, (-36.0 * (double)i / (double)0x40) / 20.0) / 4.0;

	// Pan table for the left channel
	// Right channel is identical with inverted index
	// Formula is such that pan[i]**2+pan[0xe-i]**2 = 1 (constant output power)
	// and pan[0xe] = 1 (full panning)
	for(i=0; i<0xf; i++)
		info->pantab[i] = sqrt((double)i) / sqrt((double)0xe);

	info->clock = cfg->clock;

	info->flags |= K054539_UPDATE_AT_KEYON; //* make it default until proven otherwise

	info->ram = (UINT8*)malloc(0x4000);
	info->rom = NULL;
	info->rom_size = 0x00;
	info->rom_mask = 0x00;

	k054539_init_flags(info, cfg->flags);

	k054539_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->clock / 384, &devDef);

	return 0x00;
}